

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_smpl.c
# Opt level: O0

int ec_GFp_simple_point_set_affine_coordinates
              (EC_GROUP *group,EC_POINT *point,BIGNUM *x,BIGNUM *y,BN_CTX *ctx)

{
  BIGNUM *z;
  BIGNUM *in_RCX;
  BIGNUM *in_RDX;
  EC_POINT *in_RSI;
  EC_GROUP *in_RDI;
  BN_CTX *in_R8;
  undefined4 local_4;
  
  if ((in_RDX == (BIGNUM *)0x0) || (in_RCX == (BIGNUM *)0x0)) {
    local_4 = 0;
  }
  else {
    z = BN_value_one();
    local_4 = EC_POINT_set_Jprojective_coordinates_GFp(in_RDI,in_RSI,in_RDX,in_RCX,z,in_R8);
  }
  return local_4;
}

Assistant:

int ec_GFp_simple_point_set_affine_coordinates(const EC_GROUP *group,
                                               EC_POINT *point,
                                               const BIGNUM *x,
                                               const BIGNUM *y, BN_CTX *ctx)
{
    if (x == NULL || y == NULL) {
        /*
         * unlike for projective coordinates, we do not tolerate this
         */
        // //ECerr(EC_F_EC_GFP_SIMPLE_POINT_SET_AFFINE_COORDINATES,
        //       ERR_R_PASSED_NULL_PARAMETER);
        return 0;
    }

    return EC_POINT_set_Jprojective_coordinates_GFp(group, point, x, y,
                                                    BN_value_one(), ctx);
}